

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityMessage(char *msg,UNITY_UINT line)

{
  UnityTestResultsBegin(Unity.TestFile,line);
  UnityPrint("INFO");
  if (msg != (char *)0x0) {
    putchar(0x3a);
    putchar(0x20);
    UnityPrint(msg);
  }
  putchar(10);
  return;
}

Assistant:

void UnityMessage(const char* msg, const UNITY_LINE_TYPE line)
{
    UnityTestResultsBegin(Unity.TestFile, line);
    UnityPrint("INFO");
    if (msg != NULL)
    {
      UNITY_OUTPUT_CHAR(':');
      UNITY_OUTPUT_CHAR(' ');
      UnityPrint(msg);
    }
    UNITY_PRINT_EOL();
}